

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void LoadAttributes(SstStream Stream,TSMetadataMsg MetaData)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t __size;
  char *pcVar4;
  int *element_size_p;
  long in_RSI;
  long in_RDI;
  int ElemSize;
  int Type;
  void *field_data;
  char *FieldName;
  int i;
  FFSBuffer decode_buf;
  size_t DecodedLength;
  FMStructDescList List;
  FMFormat Format;
  FMContext FMC;
  FFSTypeHandle FFSformat;
  void *BaseData;
  FMStructDescList FormatList;
  FMFieldList FieldList;
  int WriterRank;
  undefined4 local_7c;
  int *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  void *local_30;
  long local_28;
  long local_20;
  uint local_14;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  (**(code **)(in_RDI + 0x2e8))(*(undefined8 *)(in_RDI + 0x2f8),0,0);
  local_14 = 0;
  while (((int)local_14 < *(int *)(local_8 + 0x238) &&
         (*(long *)(*(long *)(local_10 + 0x28) + (long)(int)local_14 * 0x10) != 0))) {
    uVar2 = FFSTypeHandle_from_encode
                      (*(undefined8 *)(local_8 + 0x2c8),
                       *(undefined8 *)(*(long *)(local_10 + 0x28) + (long)(int)local_14 * 0x10 + 8))
    ;
    iVar1 = FFShas_conversion(uVar2);
    if (iVar1 == 0) {
      uVar3 = FMContext_from_FFS(*(undefined8 *)(local_8 + 0x2c8));
      uVar3 = FMformat_from_ID(uVar3,*(undefined8 *)
                                      (*(long *)(local_10 + 0x28) + (long)(int)local_14 * 0x10 + 8))
      ;
      uVar3 = format_list_of_FMFormat(uVar3);
      uVar3 = FMcopy_struct_list(uVar3);
      FMlocalize_structs(uVar3);
      establish_conversion(*(undefined8 *)(local_8 + 0x2c8),uVar2,uVar3);
      FMfree_struct_list(uVar3);
    }
    iVar1 = FFSdecode_in_place_possible(uVar2);
    if (iVar1 == 0) {
      __size = FFS_est_decode_length
                         (*(undefined8 *)(local_8 + 0x2c8),
                          *(undefined8 *)
                           (*(long *)(local_10 + 0x28) + (long)(int)local_14 * 0x10 + 8),
                          *(undefined8 *)(*(long *)(local_10 + 0x28) + (long)(int)local_14 * 0x10));
      local_30 = malloc(__size);
      in_stack_ffffffffffffffa0 = (char *)create_fixed_FFSBuffer(local_30,__size);
      FFSdecode_to_buffer(*(undefined8 *)(local_8 + 0x2c8),
                          *(undefined8 *)
                           (*(long *)(local_10 + 0x28) + (long)(int)local_14 * 0x10 + 8),
                          in_stack_ffffffffffffffa0);
    }
    else {
      FFSdecode_in_place(*(undefined8 *)(local_8 + 0x2c8),
                         *(undefined8 *)
                          (*(long *)(local_10 + 0x28) + (long)(int)local_14 * 0x10 + 8),&local_30);
    }
    if (LoadAttributes::DumpMetadata == -1) {
      pcVar4 = getenv("SstDumpMetadata");
      LoadAttributes::DumpMetadata = (int)(pcVar4 != (char *)0x0);
    }
    if ((LoadAttributes::DumpMetadata != 0) && (*(int *)(local_8 + 0xa8) == 0)) {
      printf("\nIncomingAttributeDatablock from WriterRank %d is %p :\n",(ulong)local_14,local_30);
      uVar3 = FMFormat_of_original(uVar2);
      FMdump_data(uVar3,local_30,0xfa000);
      printf("\n\n");
    }
    uVar2 = FMFormat_of_original(uVar2);
    local_28 = format_list_of_FMFormat(uVar2);
    local_20 = *(long *)(local_28 + 8);
    iVar1 = 0;
    while (*(long *)(local_20 + (long)iVar1 * 0x18) != 0) {
      element_size_p =
           (int *)((long)local_30 + (long)*(int *)(local_20 + (long)iVar1 * 0x18 + 0x14));
      BreakdownVarName(in_stack_ffffffffffffffa0,(char **)CONCAT44(iVar1,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90,element_size_p);
      (**(code **)(local_8 + 0x2e8))
                (*(undefined8 *)(local_8 + 0x2f8),in_stack_ffffffffffffff90,local_7c,element_size_p)
      ;
      free(in_stack_ffffffffffffff90);
      iVar1 = iVar1 + 1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

static void LoadAttributes(SstStream Stream, TSMetadataMsg MetaData)
{
    static int DumpMetadata = -1;
    Stream->AttrSetupUpcall(Stream->SetupUpcallReader, NULL, 0, NULL);
    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        FMFieldList FieldList;
        FMStructDescList FormatList;
        void *BaseData;
        FFSTypeHandle FFSformat;

        if (MetaData->AttributeData[WriterRank].DataSize == 0)
            return;

        FFSformat = FFSTypeHandle_from_encode(Stream->ReaderFFSContext,
                                              MetaData->AttributeData[WriterRank].block);
        if (!FFShas_conversion(FFSformat))
        {
            FMContext FMC = FMContext_from_FFS(Stream->ReaderFFSContext);
            FMFormat Format = FMformat_from_ID(FMC, MetaData->AttributeData[WriterRank].block);
            FMStructDescList List = FMcopy_struct_list(format_list_of_FMFormat(Format));
            FMlocalize_structs(List);
            establish_conversion(Stream->ReaderFFSContext, FFSformat, List);
            FMfree_struct_list(List);
        }

        if (FFSdecode_in_place_possible(FFSformat))
        {
            FFSdecode_in_place(Stream->ReaderFFSContext, MetaData->AttributeData[WriterRank].block,
                               &BaseData);
        }
        else
        {
            size_t DecodedLength = FFS_est_decode_length(
                Stream->ReaderFFSContext, MetaData->AttributeData[WriterRank].block,
                MetaData->AttributeData[WriterRank].DataSize);
            BaseData = malloc(DecodedLength);
            FFSBuffer decode_buf = create_fixed_FFSBuffer(BaseData, DecodedLength);
            FFSdecode_to_buffer(Stream->ReaderFFSContext, MetaData->AttributeData[WriterRank].block,
                                decode_buf);
        }
        if (DumpMetadata == -1)
        {
            DumpMetadata = (getenv("SstDumpMetadata") != NULL);
        }
        if (DumpMetadata && (Stream->Rank == 0))
        {
            printf("\nIncomingAttributeDatablock from WriterRank %d is %p :\n", WriterRank,
                   BaseData);
            FMdump_data(FMFormat_of_original(FFSformat), BaseData, 1024000);
            printf("\n\n");
        }
        FormatList = format_list_of_FMFormat(FMFormat_of_original(FFSformat));
        FieldList = FormatList[0].field_list;
        int i = 0;
        while (FieldList[i].field_name)
        {
            char *FieldName;
            void *field_data = (char *)BaseData + FieldList[i].field_offset;

            int Type;
            int ElemSize;
            BreakdownVarName(FieldList[i].field_name, &FieldName, &Type, &ElemSize);
            Stream->AttrSetupUpcall(Stream->SetupUpcallReader, FieldName, Type, field_data);
            free(FieldName);
            i++;
        }
    }
}